

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualStateIndices
          (TransitionObservationIndependentMADPDiscrete *this,Index jointSI)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  this_00;
  iterator this_01;
  pointer ppVar2;
  uint in_ESI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_vector<unsigned_int>_>_>::value,_pair<iterator,_bool>_>
  _Var3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ind_sI;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffff50;
  undefined1 local_48 [24];
  _Base_ptr local_30;
  _Self local_28;
  _Self local_20 [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  if ((*(byte *)(in_RDI + 0xca) & 1) == 0) {
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::find(in_stack_ffffffffffffff38,(key_type_conflict *)0xabdd4c);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar1 = std::operator!=(local_20,&local_28);
    if (bVar1) {
      local_30 = (_Base_ptr)
                 std::
                 map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 ::find(in_stack_ffffffffffffff38,(key_type_conflict *)0xabdda4);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)in_stack_ffffffffffffff40);
      local_8 = &ppVar2->second;
    }
    else {
      IndexTools::JointToIndividualIndicesStepSize
                ((Index)((ulong)local_48 >> 0x20),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff50)
      ;
      std::make_pair<unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
                ((uint *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40);
      _Var3 = std::
              map<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              ::
              insert<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (in_stack_ffffffffffffff50,
                         (pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      this_00 = _Var3.first._M_node;
      std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
                ((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 0xabde4f);
      this_01 = std::
                map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::find(in_stack_ffffffffffffff38,(key_type_conflict *)0xabde68);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)this_01._M_node);
      local_8 = &ppVar2->second;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_node);
    }
  }
  else {
    local_8 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)(in_RDI + 400),(ulong)in_ESI);
  }
  return local_8;
}

Assistant:

const std::vector<Index>& JointToIndividualStateIndices(Index jointSI) const
        {
            if(_m_jointIndicesCached)
                return _m_indivStateIndices[jointSI];
            else if (_m_indivStateIndicesMap->find(jointSI)!=
                     _m_indivStateIndicesMap->end())
                return(_m_indivStateIndicesMap->find(jointSI)->second);
            else
            {
                std::vector<Index> ind_sI=
                    IndexTools::JointToIndividualIndicesStepSize(jointSI,_m_stateStepSize);
                _m_indivStateIndicesMap->insert(make_pair(jointSI,ind_sI));
                return(_m_indivStateIndicesMap->find(jointSI)->second);
            }
        }